

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O3

ssize_t __thiscall pstore::brokerface::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  char local_44;
  timespec local_40;
  
  uVar1 = this->max_retries_;
  uVar6 = 0;
  while( true ) {
    if ((this->update_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      goto LAB_0010bf0d;
    }
    (*(this->update_cb_)._M_invoker)((_Any_data *)&this->update_cb_);
    iVar4 = (*this->_vptr_writer[2])(this,CONCAT44(in_register_00000034,__fd));
    if ((char)iVar4 != '\0') break;
    uVar3 = (this->retry_timeout_).__r;
    if (0 < (long)uVar3) {
      local_40.tv_sec = uVar3 / 1000;
      local_40.tv_nsec = (uVar3 % 1000) * 1000000;
      do {
        iVar4 = nanosleep(&local_40,&local_40);
        if (iVar4 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    }
    uVar6 = uVar6 + 1;
    uVar2 = this->max_retries_;
    if (uVar2 < uVar6 && uVar1 != 0xffffffff) {
LAB_0010bee9:
      if (((uVar1 == 0xffffffff) || (local_44 = (char)__buf, local_44 == '\0')) || (uVar6 <= uVar2))
      {
        return (ulong)uVar2;
      }
LAB_0010bf0d:
      raise<pstore::error_code>(pipe_write_timeout);
    }
  }
  uVar2 = this->max_retries_;
  goto LAB_0010bee9;
}

Assistant:

void writer::write (message_type const & msg, bool const error_on_timeout) {
            auto tries = 0U;
            bool const infinite_tries = max_retries_ == infinite_retries;
            for (; infinite_tries || tries <= max_retries_; ++tries) {
                update_cb_ ();
                if (this->write_impl (msg)) {
                    break;
                }
                std::this_thread::sleep_for (retry_timeout_);
            }

            if (error_on_timeout && !infinite_tries && tries > max_retries_) {
                raise (::pstore::error_code::pipe_write_timeout);
            }
        }